

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  pointer pcVar1;
  char *__s;
  string *extraout_RAX;
  size_t sVar2;
  string *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (environment_variables._M_array != (iterator)0x0) {
    lVar4 = 0;
    do {
      __s = getenv(*(char **)(this + lVar4));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar2 = strlen(__s);
        if (__s[sVar2 - 1] == '/') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,__s + sVar2);
          return extraout_RAX_00;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar2 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar2);
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_replace_aux(&local_50,local_50._M_string_length,0,1,'/');
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pbVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar3->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return extraout_RAX_01;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        return extraout_RAX_02;
      }
      lVar4 = lVar4 + 8;
    } while ((long)environment_variables._M_array << 3 != lVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)environment_variables._M_len,
             (allocator<char> *)&local_50);
  return extraout_RAX;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}